

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalGenerators.hpp
# Opt level: O0

void __thiscall
helics::apps::PhasorGenerator::PhasorGenerator(PhasorGenerator *this,string_view name)

{
  string_view name_00;
  SignalGenerator *in_RDX;
  char *in_RSI;
  undefined8 *in_RDI;
  
  name_00._M_str = in_RSI;
  name_00._M_len = (size_t)in_RDI;
  SignalGenerator::SignalGenerator(in_RDX,name_00);
  *in_RDI = &PTR__PhasorGenerator_00a47ad8;
  in_RDI[7] = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  std::complex<double>::complex((complex<double> *)(in_RDI + 0xe),1.0,0.0);
  std::complex<double>::complex((complex<double> *)(in_RDI + 0x10),1.0,0.0);
  return;
}

Assistant:

explicit PhasorGenerator(std::string_view name): SignalGenerator(name) {}